

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void fts5WriteDlidxAppend(Fts5Index *p,Fts5SegWriter *pWriter,i64 iRowid)

{
  int *pRc;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  byte bVar7;
  Fts5Buffer *pBuf;
  Fts5DlidxWriter *pFVar8;
  long lVar9;
  i64 iVar10;
  long lVar11;
  int *piVar12;
  long lVar13;
  Fts5DlidxWriter *pFVar14;
  int local_84;
  i64 iRowid_1;
  
  pRc = &p->rc;
  lVar13 = 0;
  local_84 = 2;
  lVar9 = 0x1000000000;
  lVar11 = 0;
  bVar6 = false;
  do {
    if (bVar6 || *pRc != 0) {
      return;
    }
    pFVar8 = pWriter->aDlidx;
    iVar2 = *(int *)((long)&(pFVar8->buf).n + lVar13);
    iVar3 = p->pConfig->pgsz;
    if (iVar2 < iVar3) {
      if (*(int *)((long)&pFVar8->bPrevValid + lVar13) == 0) {
        pFVar14 = pFVar8 + lVar11;
        piVar12 = &pFVar14->bPrevValid;
        bVar6 = true;
        goto LAB_001965b1;
      }
      piVar12 = (int *)((long)&pFVar8->bPrevValid + lVar13);
      pFVar14 = (Fts5DlidxWriter *)((long)&pFVar8->pgno + lVar13);
      iVar10 = iRowid - *(long *)((long)&pFVar8->iPrev + lVar13);
      bVar6 = true;
    }
    else {
      **(undefined1 **)((long)&(pFVar8->buf).p + lVar13) = 1;
      fts5DataWrite(p,((ulong)(uint)pWriter->iSegid << 0x25) + lVar9 +
                      (long)*(int *)((long)&pFVar8->pgno + lVar13),
                    *(u8 **)((long)&(pFVar8->buf).p + lVar13),
                    *(int *)((long)&(pFVar8->buf).n + lVar13));
      fts5WriteDlidxGrow(p,pWriter,local_84);
      pFVar8 = pWriter->aDlidx;
      if ((p->rc == 0) && (*(int *)((long)&pFVar8[1].buf.n + lVar13) == 0)) {
        piVar12 = (int *)((long)&pFVar8->pgno + lVar13);
        pBuf = (Fts5Buffer *)(piVar12 + 0xc);
        lVar5 = *(long *)(piVar12 + 4);
        bVar7 = sqlite3Fts5GetVarint((uchar *)(lVar5 + 1),(u64 *)&iRowid_1);
        sqlite3Fts5GetVarint((uchar *)(lVar5 + (ulong)bVar7 + 1),(u64 *)&iRowid_1);
        iVar10 = iRowid_1;
        piVar12[8] = *piVar12;
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,(long)*piVar12);
        sqlite3Fts5BufferAppendVarint(pRc,pBuf,iVar10);
        piVar12[9] = 1;
        *(i64 *)(piVar12 + 10) = iVar10;
      }
      piVar1 = (int *)((long)&pFVar8->pgno + lVar13);
      piVar12 = piVar1 + 1;
      piVar1[6] = 0;
      pFVar14 = (Fts5DlidxWriter *)((long)&pFVar8->pgno + lVar13);
      *piVar12 = 0;
      *piVar1 = *piVar1 + 1;
      bVar6 = false;
LAB_001965b1:
      pFVar8 = pFVar14 + -1;
      if (lVar13 == 0) {
        pFVar8 = (Fts5DlidxWriter *)&pWriter->writer;
      }
      iVar4 = pFVar8->pgno;
      sqlite3Fts5BufferAppendVarint(pRc,&pFVar14->buf,(ulong)(iVar3 <= iVar2));
      sqlite3Fts5BufferAppendVarint(pRc,&pFVar14->buf,(long)iVar4);
      iVar10 = iRowid;
    }
    sqlite3Fts5BufferAppendVarint(pRc,&pFVar14->buf,iVar10);
    *piVar12 = 1;
    pFVar14->iPrev = iRowid;
    lVar11 = lVar11 + 1;
    local_84 = local_84 + 1;
    lVar13 = lVar13 + 0x20;
    lVar9 = lVar9 + 0x80000000;
  } while( true );
}

Assistant:

static void fts5WriteDlidxAppend(
  Fts5Index *p, 
  Fts5SegWriter *pWriter, 
  i64 iRowid
){
  int i;
  int bDone = 0;

  for(i=0; p->rc==SQLITE_OK && bDone==0; i++){
    i64 iVal;
    Fts5DlidxWriter *pDlidx = &pWriter->aDlidx[i];

    if( pDlidx->buf.n>=p->pConfig->pgsz ){
      /* The current doclist-index page is full. Write it to disk and push
      ** a copy of iRowid (which will become the first rowid on the next
      ** doclist-index leaf page) up into the next level of the b-tree 
      ** hierarchy. If the node being flushed is currently the root node,
      ** also push its first rowid upwards. */
      pDlidx->buf.p[0] = 0x01;    /* Not the root node */
      fts5DataWrite(p, 
          FTS5_DLIDX_ROWID(pWriter->iSegid, i, pDlidx->pgno),
          pDlidx->buf.p, pDlidx->buf.n
      );
      fts5WriteDlidxGrow(p, pWriter, i+2);
      pDlidx = &pWriter->aDlidx[i];
      if( p->rc==SQLITE_OK && pDlidx[1].buf.n==0 ){
        i64 iFirst = fts5DlidxExtractFirstRowid(&pDlidx->buf);

        /* This was the root node. Push its first rowid up to the new root. */
        pDlidx[1].pgno = pDlidx->pgno;
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, 0);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, pDlidx->pgno);
        sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx[1].buf, iFirst);
        pDlidx[1].bPrevValid = 1;
        pDlidx[1].iPrev = iFirst;
      }

      sqlite3Fts5BufferZero(&pDlidx->buf);
      pDlidx->bPrevValid = 0;
      pDlidx->pgno++;
    }else{
      bDone = 1;
    }

    if( pDlidx->bPrevValid ){
      iVal = iRowid - pDlidx->iPrev;
    }else{
      i64 iPgno = (i==0 ? pWriter->writer.pgno : pDlidx[-1].pgno);
      assert( pDlidx->buf.n==0 );
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, !bDone);
      sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iPgno);
      iVal = iRowid;
    }

    sqlite3Fts5BufferAppendVarint(&p->rc, &pDlidx->buf, iVal);
    pDlidx->bPrevValid = 1;
    pDlidx->iPrev = iRowid;
  }
}